

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_local_date<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  local_date lVar1;
  value_type *pvVar2;
  region *prVar3;
  error_type *this;
  basic_value<toml::type_config> *v;
  error_info *v_00;
  basic_value<toml::type_config> *ctx_00;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  val_fmt_reg;
  type reg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  local_358;
  region local_2e0;
  region local_278;
  undefined1 local_210 [88];
  basic_value<toml::type_config> local_1b8;
  basic_value<toml::type_config> local_f0;
  
  parse_local_date_only<toml::type_config>(&local_358,loc,ctx);
  if (local_358.is_ok_ == false) {
    this = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
           ::unwrap_err(&local_358,(source_location)0x4e93a8);
    err<toml::error_info&>((failure<toml::error_info> *)local_210,(toml *)this,v_00);
    ctx_00 = (basic_value<toml::type_config> *)local_210;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)local_210);
    error_info::~error_info((error_info *)local_210);
  }
  else {
    pvVar2 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap(&local_358,(source_location)0x4e93c0);
    lVar1 = (pvVar2->
            super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
            ).super__Head_base<0UL,_toml::local_date,_false>._M_head_impl;
    result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap(&local_358,(source_location)0x4e93d8);
    prVar3 = (region *)
             result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap(&local_358,(source_location)0x4e93f0);
    region::region(&local_278,prVar3);
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_2e0,&local_278);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)(local_210 + 0x58),lVar1,&local_378,&local_2e0);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_f0,
               (toml *)(local_210 + 0x58),v);
    ctx_00 = &local_f0;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(success_type *)ctx_00);
    basic_value<toml::type_config>::~basic_value(&local_f0);
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)(local_210 + 0x58));
    region::~region(&local_2e0);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_378);
    region::~region(&local_278);
  }
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  ::cleanup(&local_358,(EVP_PKEY_CTX *)ctx_00);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_local_date(location& loc, const context<TC>& ctx)
{
    auto val_fmt_reg = parse_local_date_only(loc, ctx);
    if(val_fmt_reg.is_err())
    {
        return err(val_fmt_reg.unwrap_err());
    }

    auto val = std::move(std::get<0>(val_fmt_reg.unwrap()));
    auto fmt = std::move(std::get<1>(val_fmt_reg.unwrap()));
    auto reg = std::move(std::get<2>(val_fmt_reg.unwrap()));

    return ok(basic_value<TC>(std::move(val), std::move(fmt), {}, std::move(reg)));
}